

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

uint64_t __thiscall ImgfsFile::allocent(ImgfsFile *this,entrytype_t tag)

{
  uint uVar1;
  bool bVar2;
  uint32_t x;
  reference pvVar3;
  size_type sVar4;
  element_type *peVar5;
  reference pvVar6;
  difference_type dVar7;
  ReadWriter_ptr *this_00;
  uint local_bc;
  __normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
  local_b0;
  ImgfsFile *local_a8;
  uint64_t ofs;
  uint64_t ofs_1;
  entrytype_t *local_90;
  allocator<unsigned_char> local_72;
  value_type_conflict2 local_71;
  undefined1 local_70 [8];
  ByteVector block;
  uint32_t newdirblockofs;
  uint prevblockofs;
  entrytype_t local_39;
  entrytype_t *local_38;
  __normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
  local_30;
  __normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
  local_28;
  iterator i;
  entrytype_t tag_local;
  ImgfsFile *this_local;
  
  i._M_current._7_1_ = tag;
  local_30._M_current =
       (entrytype_t *)
       std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::begin
                 (&this->_entrymap);
  local_38 = (entrytype_t *)
             std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::end
                       (&this->_entrymap);
  local_39 = FREEENTRY;
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<ImgfsFile::entrytype_t*,std::vector<ImgfsFile::entrytype_t,std::allocator<ImgfsFile::entrytype_t>>>,ImgfsFile::entrytype_t>
                       (local_30,(__normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
                                  )local_38,&local_39);
  _newdirblockofs =
       std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::end
                 (&this->_entrymap);
  bVar2 = __gnu_cxx::operator==
                    (&local_28,
                     (__normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
                      *)&newdirblockofs);
  if (bVar2) {
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->_dir2file);
    if (bVar2) {
      local_bc = 0;
    }
    else {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->_dir2file);
      local_bc = *pvVar3 * (this->_hdr).bytesperblock;
    }
    x = allocdirblock(this);
    if (g_verbose != 0) {
      printf("added new dir block [%08x -> %08x]\n",(ulong)local_bc,(ulong)x);
    }
    registerdirblock(this,(ulong)x);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_dir2file);
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0x20;
    std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::resize
              (&this->_entrymap,sVar4 * (this->_hdr).entriesperblock,
               (value_type *)
               ((long)&block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_00 = &this->_rd;
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this_00);
    (*peVar5->_vptr_ReadWriter[4])(peVar5,(ulong)local_bc);
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this_00);
    ReadWriter::write32le(peVar5,0x2f5314ce);
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this_00);
    ReadWriter::write32le(peVar5,x);
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this_00);
    (*peVar5->_vptr_ReadWriter[4])(peVar5,(ulong)x);
    uVar1 = (this->_hdr).bytesperblock;
    local_71 = 0xff;
    std::allocator<unsigned_char>::allocator(&local_72);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,(ulong)uVar1,
               &local_71,&local_72);
    std::allocator<unsigned_char>::~allocator(&local_72);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    set32le<unsigned_char*>(pvVar6,0x2f5314ce);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,4);
    set32le<unsigned_char*>(pvVar6,0);
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_rd);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    (*peVar5->_vptr_ReadWriter[3])(peVar5,pvVar6,sVar4);
    ofs_1 = (uint64_t)
            std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::end
                      (&this->_entrymap);
    local_90 = (entrytype_t *)
               __gnu_cxx::
               __normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
               ::operator-((__normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
                            *)&ofs_1,(ulong)(this->_hdr).entriesperblock);
    ofs = (uint64_t)(x + 8);
    local_28 = (__normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
                )local_90;
    markent(this,ofs,i._M_current._7_1_);
    this_local = (ImgfsFile *)ofs;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  }
  else {
    local_b0._M_current =
         (entrytype_t *)
         std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::begin
                   (&this->_entrymap);
    dVar7 = __gnu_cxx::operator-(&local_28,&local_b0);
    local_a8 = (ImgfsFile *)index2entryofs(this,(uint)dVar7);
    markent(this,(uint64_t)local_a8,i._M_current._7_1_);
    this_local = local_a8;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t allocent(entrytype_t tag)
    {
        // NOTE: performance warning - linear search
        entrymap_t::iterator i= std::find(_entrymap.begin(), _entrymap.end(), FREEENTRY);
        if (i==_entrymap.end()) {
            unsigned prevblockofs= _dir2file.empty() ? 0 : _dir2file.back()*_hdr.bytesperblock;
            uint32_t newdirblockofs= allocdirblock();

            if (g_verbose)
                printf("added new dir block [%08x -> %08x]\n", prevblockofs, newdirblockofs);
            registerdirblock(newdirblockofs);
            _entrymap.resize(_dir2file.size()*_hdr.entriesperblock, FREEENTRY);
            // link to previous block
            _rd->setpos(prevblockofs);
            _rd->write32le(0x2f5314ce);
            _rd->write32le(newdirblockofs);

            _rd->setpos(newdirblockofs);
            ByteVector block(_hdr.bytesperblock, 0xff);
            set32le(&block[0], 0x2f5314ce);
            set32le(&block[4], 0);
            _rd->write(&block[0], block.size());
            //printf("write empty dirblock at %08x\n", newdirblockofs);

            i= _entrymap.end()-_hdr.entriesperblock;

            uint64_t ofs= newdirblockofs+8;
            markent(ofs, tag);
            return ofs;
        }
        uint64_t ofs= index2entryofs(i-_entrymap.begin());
//        printf("allocent(%c) -> %d : %d : %08llx\n", tag, int(i-_entrymap.begin()), *i, ofs);
        markent(ofs, tag);

        return ofs;
    }